

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t validate_deep_data(exr_context_t f,exr_priv_part_t curpart)

{
  int *piVar1;
  exr_result_t eVar2;
  long in_RSI;
  long in_RDI;
  int c;
  exr_attr_chlist_t *channels;
  int local_24;
  
  if ((*(int *)(in_RSI + 4) == 2) || (*(int *)(in_RSI + 4) == 3)) {
    piVar1 = *(int **)(*(long *)(in_RSI + 0x20) + 0x18);
    if ((*(int *)(in_RSI + 0xb0) != 0) &&
       ((*(int *)(in_RSI + 0xb0) != 1 && (*(int *)(in_RSI + 0xb0) != 2)))) {
      eVar2 = (**(code **)(in_RDI + 0x40))(in_RDI,0xe,"Invalid compression for deep data");
      return eVar2;
    }
    for (local_24 = 0; local_24 < *piVar1; local_24 = local_24 + 1) {
      if (*(int *)(*(long *)(piVar1 + 2) + (long)local_24 * 0x20 + 0x18) != 1) {
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': x subsampling factor is not 1 (%d) for a deep image",
                           *(undefined8 *)(*(long *)(piVar1 + 2) + (long)local_24 * 0x20 + 8),
                           *(undefined4 *)(*(long *)(piVar1 + 2) + (long)local_24 * 0x20 + 0x18));
        return eVar2;
      }
      if (*(int *)(*(long *)(piVar1 + 2) + (long)local_24 * 0x20 + 0x1c) != 1) {
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': y subsampling factor is not 1 (%d) for a deep image",
                           *(undefined8 *)(*(long *)(piVar1 + 2) + (long)local_24 * 0x20 + 8),
                           *(undefined4 *)(*(long *)(piVar1 + 2) + (long)local_24 * 0x20 + 0x1c));
        return eVar2;
      }
    }
  }
  return 0;
}

Assistant:

static exr_result_t
validate_deep_data (exr_context_t f, exr_priv_part_t curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_chlist_t* channels = curpart->channels->chlist;

        // none, rle, zips
        if (curpart->comp_type != EXR_COMPRESSION_NONE &&
            curpart->comp_type != EXR_COMPRESSION_RLE &&
            curpart->comp_type != EXR_COMPRESSION_ZIPS)
            return f->report_error (
                f, EXR_ERR_INVALID_ATTR, "Invalid compression for deep data");

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}